

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype.cpp
# Opt level: O3

void __thiscall Contact::Contact(Contact *this,string *name,shared_ptr<Address> *address)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  Address *__args;
  undefined8 uVar4;
  undefined1 local_19;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar4;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  __args = (address->super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (__args == (Address *)0x0) {
    (this->work_address).super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->work_address).super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (this->work_address).super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Address,std::allocator<Address>,Address&>
              (&(this->work_address).super___shared_ptr<Address,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Address **)&this->work_address,(allocator<Address> *)&local_19,__args);
  }
  return;
}

Assistant:

explicit Contact(std::string name, std::shared_ptr<Address> address)
		:	name{std::move(name)},
			work_address{address ? std::make_shared<Address>(*address) : nullptr}
	{}